

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O1

void Vec_VecExpand(Vec_Vec_t *p,int Level)

{
  int iVar1;
  void **ppvVar2;
  undefined8 *puVar3;
  int iVar4;
  long lVar5;
  
  if (p->nSize <= Level) {
    iVar1 = Level + 1;
    if (p->nCap <= Level) {
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,(long)iVar1 << 3);
      }
      p->pArray = ppvVar2;
      p->nCap = iVar1;
    }
    iVar4 = p->nSize;
    lVar5 = (long)iVar4;
    if (iVar4 <= Level) {
      iVar4 = (Level - iVar4) + 1;
      do {
        puVar3 = (undefined8 *)malloc(0x10);
        *puVar3 = 0;
        puVar3[1] = 0;
        p->pArray[lVar5] = puVar3;
        lVar5 = lVar5 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    p->nSize = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_VecExpand( Vec_Vec_t * p, int Level )
{
    int i;
    if ( p->nSize >= Level + 1 )
        return;
    Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
    for ( i = p->nSize; i <= Level; i++ )
        p->pArray[i] = Vec_PtrAlloc( 0 );
    p->nSize = Level + 1;
}